

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MIPS.cpp
# Opt level: O1

double getDistance(Mesh *mesh,VectorXd *params,EdgeHandle *e,VertexHandle *p)

{
  long lVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  long lVar9;
  float fVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double __x;
  
  lVar1 = *(long *)&(mesh->super_Mesh).
                    super_AttribKernelT<OpenMesh::FinalMeshItemsT<OpenMesh::DefaultTraits,_false>,_OpenMesh::PolyConnectivity>
                    .super_PolyConnectivity.field_0xe0;
  lVar9 = ((long)((ulong)(uint)(e->super_BaseHandle).idx_ << 0x21) >> 0x21) * 0x20;
  pdVar2 = (params->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
  ;
  dVar5 = pdVar2[(long)*(int *)(lVar1 + 4 + lVar9) * 2];
  dVar6 = (pdVar2 + (long)*(int *)(lVar1 + 4 + lVar9) * 2)[1];
  dVar7 = pdVar2[(long)*(int *)(lVar1 + 0x14 + lVar9) * 2];
  dVar8 = (pdVar2 + (long)*(int *)(lVar1 + 0x14 + lVar9) * 2)[1];
  dVar4 = dVar7 - dVar5;
  dVar11 = dVar8 - dVar6;
  dVar14 = pdVar2[(long)(p->super_BaseHandle).idx_ * 2];
  dVar15 = (pdVar2 + (long)(p->super_BaseHandle).idx_ * 2)[1];
  dVar12 = dVar14 - dVar5;
  dVar13 = dVar15 - dVar6;
  dVar3 = dVar11 * dVar11 + dVar4 * dVar4;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  __x = dVar13 * dVar13 + dVar12 * dVar12;
  fVar10 = (float)(__x - (dVar13 * dVar11 + dVar4 * dVar12) / dVar3);
  if (fVar10 < 0.0) {
    fVar10 = sqrtf(fVar10);
  }
  else {
    fVar10 = SQRT(fVar10);
  }
  dVar14 = dVar14 - dVar7;
  dVar15 = dVar15 - dVar8;
  if (0.0 <= (dVar6 - dVar8) * dVar15 + dVar14 * (dVar5 - dVar7)) {
    if (0.0 <= dVar13 * dVar11 + dVar4 * dVar12) {
      return (double)fVar10;
    }
  }
  else {
    __x = dVar15 * dVar15 + dVar14 * dVar14;
  }
  if (0.0 <= __x) {
    return SQRT(__x);
  }
  dVar3 = sqrt(__x);
  return dVar3;
}

Assistant:

double getDistance(const Mesh& mesh, const Eigen::VectorXd& params, const OpenMesh::EdgeHandle& e, const OpenMesh::VertexHandle& p) {
    int st = mesh.to_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
    int end = mesh.from_vertex_handle(mesh.halfedge_handle(e, 0)).idx();
    OpenMesh::Vec2d pst(params[2 * st], params[2 * st + 1]); 
    OpenMesh::Vec2d pend(params[2 * end], params[2 * end + 1]); 
    OpenMesh::Vec2d edge = pend - pst;

    OpenMesh::Vec2d point(params[p.idx() * 2], params[p.idx() * 2 + 1]);
    double projected = OpenMesh::dot(point - pst, edge) / edge.norm();
    double dis = sqrtf(OpenMesh::dot(point - pst, point - pst) - projected);

    if (OpenMesh::dot(point - pend, pst - pend) < 0.0) 
        dis = (point - pend).norm();
    else if (OpenMesh::dot(point - pst, pend - pst) < 0.0) 
        dis = (point - pst).norm();

    return dis;
}